

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::skippedSpace(XMLReader *this)

{
  byte bVar1;
  XMLCh XVar2;
  bool bVar3;
  undefined8 in_RAX;
  XMLSize_t XVar4;
  XMLCh curCh;
  undefined8 uStack_18;
  
  XVar4 = this->fCharIndex;
  uStack_18 = in_RAX;
  if (XVar4 == this->fCharsAvail) {
    bVar3 = refreshCharBuffer(this);
    if (!bVar3) {
      return false;
    }
    XVar4 = this->fCharIndex;
  }
  XVar2 = this->fCharBuf[XVar4];
  uStack_18 = CONCAT26(XVar2,(undefined6)uStack_18);
  bVar1 = this->fgCharCharsTable[(ushort)XVar2];
  if ((char)bVar1 < '\0') {
    this->fCharIndex = XVar4 + 1;
    if ((XVar2 & 6U) == 0) {
      this->fCurCol = this->fCurCol + 1;
    }
    else {
      handleEOL(this,(XMLCh *)((long)&uStack_18 + 6),false);
    }
  }
  return (bool)(bVar1 >> 7);
}

Assistant:

bool XMLReader::skippedSpace()
{
    //
    //  If the buffer is empty, then try to reload it. If we still get
    //  nothing, then return false.
    //
    if (fCharIndex == fCharsAvail)
    {
        if (!refreshCharBuffer())
            return false;
    }

    //
    //  See if the current char is a whitespace. If so, then we need to eat
    //  it and return true.
    //
    const XMLCh curCh = fCharBuf[fCharIndex];
    if (isWhitespace(curCh))
    {
        // Eat the character
        fCharIndex++;

        //
        //  'curCh' is a whitespace(x20|x9|xD|xA), so we only can have
        //  end-of-line combinations with a leading chCR(xD) or chLF(xA)
        //
        //  100000 x20
        //  001001 x9
        //  001010 chLF
        //  001101 chCR
        //  -----------
        //  000110 == (chCR|chLF) & ~(0x9|0x20)
        //
        //  if the result of the logical-& operation is
        //  true  : 'curCh' must be xA  or xD
        //  false : 'curCh' must be x20 or x9
        //
        if ( ( curCh & (chCR|chLF) & ~(0x9|0x20) ) == 0 )
        {
            fCurCol++;
        } else
        {
            handleEOL((XMLCh&)curCh, false);
        }

        return true;
    }
    return false;
}